

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall
testing::anon_unknown_6::MockObjectRegistry::~MockObjectRegistry(MockObjectRegistry *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  undefined8 extraout_RAX;
  undefined8 in_RCX;
  int iVar3;
  _Link_type in_RSI;
  char *pcVar4;
  MutexLock l;
  string local_50;
  
  if (FLAGS_gmock_catch_leaked_mocks == '\x01') {
    l.mutex_ = (MutexBase *)internal::g_gmock_mutex;
    internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
    iVar3 = 0;
    for (p_Var2 = (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->states_)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (*(char *)&p_Var2[3]._M_right == '\0') {
        std::operator<<((ostream *)&std::cout,"\n");
        internal::FormatFileLocation_abi_cxx11_
                  (&local_50,(internal *)p_Var2[1]._M_parent,
                   (char *)(ulong)*(uint *)&p_Var2[1]._M_left,(int)in_RCX);
        std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::operator<<((ostream *)&std::cout," ERROR: this mock object");
        if (*(long *)(p_Var2 + 3) != 0) {
          poVar1 = std::operator<<((ostream *)&std::cout," (used in test ");
          poVar1 = std::operator<<(poVar1,(string *)&p_Var2[1]._M_right);
          poVar1 = std::operator<<(poVar1,".");
          poVar1 = std::operator<<(poVar1,(string *)&p_Var2[2]._M_right);
          std::operator<<(poVar1,")");
        }
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 " should be deleted but never is. Its address is @");
        poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
        in_RSI = (_Link_type)0x13a89c;
        std::operator<<(poVar1,".");
        iVar3 = iVar3 + 1;
      }
    }
    if (0 < iVar3) {
      poVar1 = std::operator<<((ostream *)&std::cout,"\nERROR: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
      poVar1 = std::operator<<(poVar1," leaked mock ");
      pcVar4 = "objects";
      if (iVar3 == 1) {
        pcVar4 = "object";
      }
      poVar1 = std::operator<<(poVar1,pcVar4);
      std::operator<<(poVar1,
                      " found at program exit. Expectations on a mock object are verified when the object is destructed. Leaking a mock means that its expectations aren\'t verified, which is usually a test bug. If you really intend to leak a mock, you can suppress this error using testing::Mock::AllowLeak(mock_object), or you may use a fake or stub instead of a mock.\n"
                     );
      std::ostream::flush();
      std::ostream::flush();
      _Exit(1);
      __clang_call_terminate(extraout_RAX);
    }
    internal::GTestMutexLock::~GTestMutexLock(&l);
  }
  std::
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>,_std::_Select1st<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  ::_M_erase((_Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>,_std::_Select1st<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
              *)(this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
  return;
}

Assistant:

~MockObjectRegistry() {
    if (!GMOCK_FLAG_GET(catch_leaked_mocks)) return;
    internal::MutexLock l(&internal::g_gmock_mutex);

    int leaked_count = 0;
    for (StateMap::const_iterator it = states_.begin(); it != states_.end();
         ++it) {
      if (it->second.leakable)  // The user said it's fine to leak this object.
        continue;

      // FIXME: Print the type of the leaked object.
      // This can help the user identify the leaked object.
      std::cout << "\n";
      const MockObjectState& state = it->second;
      std::cout << internal::FormatFileLocation(state.first_used_file,
                                                state.first_used_line);
      std::cout << " ERROR: this mock object";
      if (!state.first_used_test.empty()) {
        std::cout << " (used in test " << state.first_used_test_suite << "."
                  << state.first_used_test << ")";
      }
      std::cout << " should be deleted but never is. Its address is @"
                << it->first << ".";
      leaked_count++;
    }
    if (leaked_count > 0) {
      std::cout << "\nERROR: " << leaked_count << " leaked mock "
                << (leaked_count == 1 ? "object" : "objects")
                << " found at program exit. Expectations on a mock object are "
                   "verified when the object is destructed. Leaking a mock "
                   "means that its expectations aren't verified, which is "
                   "usually a test bug. If you really intend to leak a mock, "
                   "you can suppress this error using "
                   "testing::Mock::AllowLeak(mock_object), or you may use a "
                   "fake or stub instead of a mock.\n";
      std::cout.flush();
      ::std::cerr.flush();
      // RUN_ALL_TESTS() has already returned when this destructor is
      // called.  Therefore we cannot use the normal Google Test
      // failure reporting mechanism.
#ifdef GTEST_OS_QURT
      qurt_exception_raise_fatal();
#else
      _Exit(1);  // We cannot call exit() as it is not reentrant and
                 // may already have been called.
#endif
    }
  }